

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void deflate_set_costs_from_codes(libdeflate_compressor *c,deflate_lens *lens)

{
  uint uVar1;
  uint local_34;
  uint local_30;
  uint local_2c;
  u32 bits_2;
  u32 bits_1;
  uint litlen_sym;
  uint length_slot;
  u32 bits;
  uint i;
  deflate_lens *lens_local;
  libdeflate_compressor *c_local;
  
  for (i = 0; i < 0x100; i = i + 1) {
    if (lens->litlen[i] == '\0') {
      local_2c = 0xd;
    }
    else {
      local_2c = (uint)lens->litlen[i];
    }
    *(uint *)((long)&c->p + (ulong)i * 4 + 0x88d0c4) = local_2c << 4;
  }
  for (i = 3; i < 0x103; i = i + 1) {
    uVar1 = ""[i] + 0x101;
    if (lens->litlen[uVar1] == '\0') {
      local_30 = 0xd;
    }
    else {
      local_30 = (uint)lens->litlen[uVar1];
    }
    *(uint *)((long)&c->p + (ulong)i * 4 + 0x88d4c4) = (""[(uint)""[i]] + local_30) * 0x10;
  }
  for (i = 0; i < 0x1e; i = i + 1) {
    if (lens->offset[i] == '\0') {
      local_34 = 10;
    }
    else {
      local_34 = (uint)lens->offset[i];
    }
    *(uint *)((long)&c->p + (ulong)i * 4 + 0x88d8d0) = (""[i] + local_34) * 0x10;
  }
  return;
}

Assistant:

static void
deflate_set_costs_from_codes(struct libdeflate_compressor *c,
			     const struct deflate_lens *lens)
{
	unsigned i;

	/* Literals */
	for (i = 0; i < DEFLATE_NUM_LITERALS; i++) {
		u32 bits = (lens->litlen[i] ?
			    lens->litlen[i] : LITERAL_NOSTAT_BITS);

		c->p.n.costs.literal[i] = bits * BIT_COST;
	}

	/* Lengths */
	for (i = DEFLATE_MIN_MATCH_LEN; i <= DEFLATE_MAX_MATCH_LEN; i++) {
		unsigned length_slot = deflate_length_slot[i];
		unsigned litlen_sym = DEFLATE_FIRST_LEN_SYM + length_slot;
		u32 bits = (lens->litlen[litlen_sym] ?
			    lens->litlen[litlen_sym] : LENGTH_NOSTAT_BITS);

		bits += deflate_extra_length_bits[length_slot];
		c->p.n.costs.length[i] = bits * BIT_COST;
	}

	/* Offset slots */
	for (i = 0; i < ARRAY_LEN(deflate_offset_slot_base); i++) {
		u32 bits = (lens->offset[i] ?
			    lens->offset[i] : OFFSET_NOSTAT_BITS);

		bits += deflate_extra_offset_bits[i];
		c->p.n.costs.offset_slot[i] = bits * BIT_COST;
	}
}